

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint8_t uVar1;
  rle16_t *array_00;
  array_container_t *c;
  uint16_t *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  array_container_t *run;
  int32_t iVar8;
  uint16_t ikey;
  ushort uVar9;
  int iVar10;
  rle16_t *prVar11;
  uint uVar12;
  long lVar13;
  array_container_t *array;
  ulong uVar14;
  uint8_t new_type;
  uint local_84;
  ulong local_80;
  rle16_t *local_78;
  uint local_70;
  uint local_6c;
  ulong local_68;
  long local_60;
  uint local_54;
  rle16_t *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  uint16_t ikey_00;
  
  if (min <= max) {
    local_54 = min >> 0x10;
    uVar4 = count_less((r->high_low_container).keys,(r->high_low_container).size,
                       (uint16_t)(min >> 0x10));
    uVar14 = (ulong)uVar4;
    uVar12 = min & 0xffff;
    local_6c = max & 0xffff;
    local_60 = (long)(int)uVar4;
    local_38 = (ulong)uVar4;
    local_48 = local_60 * 2;
    local_40 = local_60 * 8;
    lVar13 = 0;
    local_68 = (ulong)uVar4;
    local_84 = uVar12;
    local_80 = uVar14;
    local_70 = max >> 0x10;
    while( true ) {
      iVar10 = (r->high_low_container).size;
      iVar7 = (int)lVar13;
      if ((long)iVar10 <= local_60 + lVar13) break;
      uVar9 = *(ushort *)((long)(r->high_low_container).keys + lVar13 * 2 + local_48);
      if (local_70 < uVar9) break;
      uVar4 = 0;
      if (local_54 == uVar9) {
        uVar4 = uVar12;
      }
      uVar12 = 0xffff;
      if (local_70 == uVar9) {
        uVar12 = local_6c;
      }
      ra_unshare_container_at_index(&r->high_low_container,(short)local_38 + (short)lVar13);
      run = *(array_container_t **)
             ((long)(r->high_low_container).containers + lVar13 * 8 + local_40);
      uVar1 = (r->high_low_container).typecodes[lVar13 + local_60];
      ikey = (uint16_t)uVar12;
      ikey_00 = (uint16_t)uVar4;
      if (uVar1 == '\x03') {
        prVar11 = (rle16_t *)(long)run->cardinality;
        if (prVar11 == (rle16_t *)0x0) {
          run = (array_container_t *)0x0;
          uVar12 = local_84;
          goto LAB_00102706;
        }
        array_00 = (rle16_t *)run->array;
        if ((uVar4 <= array_00->value) &&
           ((ushort)(array_00[(long)((long)&prVar11[-1].length + 1)].length +
                    array_00[(long)((long)&prVar11[-1].length + 1)].value) <= uVar12))
        goto LAB_001025ef;
        local_78 = prVar11;
        uVar5 = rle16_find_run(array_00,run->cardinality,ikey_00);
        local_50 = array_00;
        uVar6 = rle16_find_run(array_00,(int32_t)local_78,ikey);
        if ((int)uVar5 < 0) {
          uVar5 = ~uVar5;
LAB_00102662:
          if ((int)uVar6 < 0) {
            uVar6 = -uVar6 - 2;
          }
          else {
            uVar9 = local_50[uVar6].length + local_50[uVar6].value;
            if (uVar12 < uVar9) {
              local_50[uVar6].value = ikey + 1;
              local_50[uVar6].length = uVar9 - (ikey + 1);
              uVar6 = uVar6 - 1;
            }
          }
          if ((int)uVar5 <= (int)uVar6) {
            uVar6 = ~uVar6;
            iVar8 = (int32_t)local_78;
            iVar10 = iVar8 + uVar6;
            iVar7 = uVar5 + uVar6;
            prVar11 = local_50;
            if ((iVar7 != 0 && SCARRY4(uVar5,uVar6) == iVar7 < 0) &&
               (run->capacity < iVar7 + iVar10)) {
              run_container_grow((run_container_t *)run,iVar7 + iVar10,true);
              iVar8 = run->cardinality;
              prVar11 = (rle16_t *)run->array;
            }
            memmove(prVar11 + ((iVar8 - iVar10) + iVar7),prVar11 + (iVar8 - iVar10),
                    (long)iVar10 << 2);
            run->cardinality = run->cardinality + iVar7;
          }
        }
        else {
          prVar11 = (rle16_t *)(ulong)uVar5;
          uVar9 = local_50[(long)prVar11].value;
          if (uVar4 <= uVar9) goto LAB_00102662;
          if ((uint)local_50[(long)prVar11].length + (uint)uVar9 <= uVar12) {
            local_50[(long)prVar11].length = ikey_00 + ~uVar9;
            uVar5 = uVar5 + 1;
            goto LAB_00102662;
          }
          local_78 = prVar11;
          makeRoomAtIndex((run_container_t *)run,(short)uVar5 + 1);
          prVar11 = (rle16_t *)run->array;
          prVar11[(long)((long)&local_78->value + 1)].value = ikey + 1;
          uVar9 = prVar11[(long)local_78].value;
          prVar11[(long)((long)&local_78->value + 1)].length =
               ~ikey + uVar9 + prVar11[(long)local_78].length;
          prVar11[(long)local_78].length = ikey_00 + ~uVar9;
        }
        run = (array_container_t *)
              convert_run_to_efficient_container((run_container_t *)run,&new_type);
        uVar14 = local_80;
        uVar12 = local_84;
      }
      else if (uVar1 == '\x02') {
        uVar4 = count_greater((uint16_t *)run->array,run->cardinality,ikey);
        uVar5 = count_less((uint16_t *)run->array,run->cardinality - uVar4,ikey_00);
        uVar12 = local_84;
        if (uVar5 + uVar4 == 0) {
LAB_001025ef:
          run = (array_container_t *)0x0;
          uVar14 = local_80;
          uVar12 = local_84;
        }
        else {
          new_type = '\x02';
          iVar10 = run->cardinality - (uVar5 + uVar4);
          uVar14 = local_80;
          if (iVar10 != 0) {
            memmove(&((rle16_t *)run->array)->value + uVar5,
                    &((rle16_t *)run->array)->value + (uVar5 + iVar10),(ulong)uVar4 * 2);
            run->cardinality = run->cardinality - iVar10;
            uVar14 = local_80;
          }
        }
      }
      else {
        iVar10 = run->cardinality;
        local_78 = (rle16_t *)run->array;
        iVar7 = bitset_lenrange_cardinality((uint64_t *)local_78,uVar4,uVar12 - uVar4);
        iVar10 = iVar10 - iVar7;
        if (iVar10 == 0) goto LAB_001025ef;
        if (iVar10 < 0x1001) {
          new_type = '\x02';
          bitset_reset_range((uint64_t *)local_78,uVar4,uVar12 + 1);
          run->cardinality = iVar10;
          run = array_container_from_bitset((bitset_container_t *)run);
          uVar14 = local_80;
          uVar12 = local_84;
        }
        else {
          new_type = '\x01';
          bitset_reset_range((uint64_t *)local_78,uVar4,uVar12 + 1);
          run->cardinality = iVar10;
          uVar14 = local_80;
          uVar12 = local_84;
        }
      }
LAB_00102706:
      c = *(array_container_t **)((long)(r->high_low_container).containers + lVar13 * 8 + local_40);
      if (run != c) {
        container_free(c,(r->high_low_container).typecodes[lVar13 + local_60]);
      }
      if (run != (array_container_t *)0x0) {
        puVar2 = (r->high_low_container).keys;
        iVar10 = (int)local_68;
        puVar2[iVar10] = *(uint16_t *)((long)puVar2 + lVar13 * 2 + local_48);
        (r->high_low_container).containers[iVar10] = run;
        (r->high_low_container).typecodes[iVar10] = new_type;
        local_68 = (ulong)(iVar10 + 1);
      }
      lVar13 = lVar13 + 1;
    }
    iVar3 = (int)uVar14;
    if ((int)local_68 < iVar3 + iVar7) {
      ra_shift_tail(&r->high_low_container,(iVar10 - iVar3) - iVar7,((int)local_68 - iVar3) - iVar7)
      ;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min,
                                        uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, (uint16_t)min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min =
            (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max =
            (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, (uint16_t)src);
        container_t *new_container;
        uint8_t new_type;
        new_container =
            container_remove_range(ra->containers[src], ra->typecodes[src],
                                   container_min, container_max, &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src], ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}